

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_fill_rect_multi_color
               (nk_command_buffer *b,nk_rect rect,nk_color left,nk_color top,nk_color right,
               nk_color bottom)

{
  float fVar1;
  void *pvVar2;
  float fVar3;
  float fVar6;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar7;
  float fVar9;
  undefined1 auVar8 [16];
  float fStack_40;
  float fStack_3c;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2275,
                  "void nk_fill_rect_multi_color(struct nk_command_buffer *, struct nk_rect, struct nk_color, struct nk_color, struct nk_color, struct nk_color)"
                 );
  }
  fVar7 = rect.w;
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    fVar9 = rect.h;
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      fVar3 = rect.x;
      fVar6 = rect.y;
      if (b->use_clipping != 0) {
        fVar1 = (b->clip).x;
        if (fVar3 + fVar7 < fVar1) {
          return;
        }
        if (fVar1 + (b->clip).w < fVar3) {
          return;
        }
        fVar7 = (b->clip).y;
        if (fVar9 + fVar6 < fVar7) {
          return;
        }
        if (fVar7 + (b->clip).h < fVar6) {
          return;
        }
      }
      pvVar2 = nk_command_buffer_push(b,NK_COMMAND_RECT_MULTI_COLOR,0x28);
      fStack_40 = rect.x;
      fStack_3c = rect.y;
      auVar8._8_8_ = rect._8_8_;
      auVar8._0_8_ = rect._8_8_;
      if (pvVar2 != (void *)0x0) {
        auVar4._0_4_ = (int)fVar3;
        auVar4._4_4_ = (int)fVar6;
        auVar4._8_4_ = (int)fStack_40;
        auVar4._12_4_ = (int)fStack_3c;
        auVar4 = pshuflw(auVar4,auVar4,0xe8);
        *(int *)((long)pvVar2 + 0x10) = auVar4._0_4_;
        auVar8 = maxps(auVar8,(undefined1  [16])0x0);
        auVar5._0_4_ = (int)auVar8._0_4_;
        auVar5._4_4_ = (int)auVar8._4_4_;
        auVar5._8_4_ = (int)auVar8._8_4_;
        auVar5._12_4_ = (int)auVar8._12_4_;
        auVar8 = pshuflw(auVar5,auVar5,0xe8);
        *(int *)((long)pvVar2 + 0x14) = auVar8._0_4_;
        *(nk_color *)((long)pvVar2 + 0x18) = left;
        *(nk_color *)((long)pvVar2 + 0x1c) = top;
        *(nk_color *)((long)pvVar2 + 0x24) = right;
        *(nk_color *)((long)pvVar2 + 0x20) = bottom;
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_fill_rect_multi_color(struct nk_command_buffer *b, struct nk_rect rect,
    struct nk_color left, struct nk_color top, struct nk_color right,
    struct nk_color bottom)
{
    struct nk_command_rect_multi_color *cmd;
    NK_ASSERT(b);
    if (!b || rect.w == 0 || rect.h == 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
            clip->x, clip->y, clip->w, clip->h)) return;
    }

    cmd = (struct nk_command_rect_multi_color*)
        nk_command_buffer_push(b, NK_COMMAND_RECT_MULTI_COLOR, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)rect.x;
    cmd->y = (short)rect.y;
    cmd->w = (unsigned short)NK_MAX(0, rect.w);
    cmd->h = (unsigned short)NK_MAX(0, rect.h);
    cmd->left = left;
    cmd->top = top;
    cmd->right = right;
    cmd->bottom = bottom;
}